

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getServer
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  
  if (getp_getServer(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getServer();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getServer::desc);
  if (iVar2 == 0) {
    vVar1 = *(vm_obj_id_t *)((this->super_CVmObject).ext_ + 0x10);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar1;
    if (vVar1 == 0) {
      retval->typ = VM_NIL;
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getServer(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* return the server object */
    retval->set_obj_or_nil(get_ext()->server);

    /* handled */
    return TRUE;
}